

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O3

void __thiscall bssl::Vector<TagAndArray>::clear(Vector<TagAndArray> *this)

{
  TagAndArray *orig_ptr;
  size_t sVar1;
  
  orig_ptr = this->data_;
  sVar1 = this->size_;
  if (sVar1 != 0) {
    do {
      Vector<unsigned_long>::~Vector(&orig_ptr->vec);
      orig_ptr = (TagAndArray *)(&orig_ptr->vec + 1);
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
    orig_ptr = this->data_;
  }
  OPENSSL_free(orig_ptr);
  this->data_ = (TagAndArray *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  return;
}

Assistant:

void clear() {
    std::destroy_n(data_, size_);
    OPENSSL_free(data_);
    data_ = nullptr;
    size_ = 0;
    capacity_ = 0;
  }